

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllZeros(IEEEFloat *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Significand *pSVar4;
  
  uVar1 = this->semantics->precision;
  if (uVar1 - 0x40 < 0xffffff80) {
    pSVar4 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar4 = &this->significand;
  }
  uVar2 = (uVar1 + 0x40 >> 6) - 1;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (pSVar4[uVar3].part != 0) {
        return false;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar1 = ((uVar1 + 0x40 & 0xffffffc0) - uVar1) + 1;
  if (uVar1 < 0x41) {
    return pSVar4[uVar2].part << ((byte)uVar1 & 0x3f) == 0;
  }
  __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"clear than integerPartWidth\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x32a,"bool llvm::detail::IEEEFloat::isSignificandAllZeros() const");
}

Assistant:

bool IEEEFloat::isSignificandAllZeros() const {
  // Test if the significand excluding the integral bit is all zeros. This
  // allows us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();

  for (unsigned i = 0; i < PartCount - 1; i++)
    if (Parts[i])
      return false;

  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "clear than integerPartWidth");
  const integerPart HighBitMask = ~integerPart(0) >> NumHighBits;

  if (Parts[PartCount - 1] & HighBitMask)
    return false;

  return true;
}